

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CropFace.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  String output_path;
  Mat image;
  allocator<char> local_191;
  String local_190;
  long *local_170;
  long local_168;
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  allocator<char> local_130 [16];
  long local_120;
  Mat local_d0 [96];
  string local_70 [96];
  
  if (argc != 2) {
    puts("usage: CropFace <Image_Path>");
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,argv[1],local_130);
  std::__cxx11::string::append((char *)&local_170);
  cv::Mat::Mat((Mat *)local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_150,argv[1],&local_191);
  cv::imread(local_70,(int)local_150);
  cv::Mat::operator=((Mat *)local_130,(Mat *)local_70);
  cv::Mat::~Mat((Mat *)local_70);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  if (local_120 == 0) {
    __s = "No image data ";
  }
  else {
    cVar1 = cv::CascadeClassifier::load((string *)cascade);
    if (cVar1 != '\0') {
      cv::Mat::Mat(local_d0,(Mat *)local_130);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_170,local_168 + (long)local_170);
      detectAndSave(local_d0,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      cv::Mat::~Mat(local_d0);
      iVar2 = 0;
      goto LAB_001024f5;
    }
    __s = "--(!)Error loading face cascade";
  }
  puts(__s);
  iVar2 = -1;
LAB_001024f5:
  cv::Mat::~Mat((Mat *)local_130);
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv ){
    if ( argc != 2 ){
        printf("usage: CropFace <Image_Path>\n");
        return -1;
    }
    String output_path = argv[1];
    output_path += "_face.jpg";

    Mat image;
    image = imread( argv[1], 1 );

    if ( !image.data ){
        printf("No image data \n");
        return -1;
    }

    // load cascades
    if( !cascade.load( face_cascade_name ) ){ printf("--(!)Error loading face cascade\n"); return -1; };
    detectAndSave( image, output_path );

    return 0;
}